

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomGradient::read(DomGradient *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  char cVar2;
  int iVar3;
  DomGradientStop *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  long lVar4;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar4 = 0;
    do {
      local_68.m_data = *(storage_type_conflict **)(local_50.ptr + lVar4 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar4 + 0x10);
      if ((local_68.m_size == 6) &&
         (QVar5.m_data = local_68.m_data, QVar5.m_size = 6, QVar18.m_data = L"startx",
         QVar18.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar5,QVar18), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_startX = dVar1;
        this->m_has_attr_startX = true;
      }
      else if ((local_68.m_size == 6) &&
              (QVar6.m_data = local_68.m_data, QVar6.m_size = 6, QVar19.m_data = L"starty",
              QVar19.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar6,QVar19), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_startY = dVar1;
        this->m_has_attr_startY = true;
      }
      else if ((local_68.m_size == 4) &&
              (QVar7.m_data = local_68.m_data, QVar7.m_size = 4, QVar20.m_data = L"endx",
              QVar20.m_size = 4, cVar2 = QtPrivate::equalStrings(QVar7,QVar20), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_endX = dVar1;
        this->m_has_attr_endX = true;
      }
      else if ((local_68.m_size == 4) &&
              (QVar8.m_data = local_68.m_data, QVar8.m_size = 4, QVar21.m_data = L"endy",
              QVar21.m_size = 4, cVar2 = QtPrivate::equalStrings(QVar8,QVar21), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_endY = dVar1;
        this->m_has_attr_endY = true;
      }
      else if ((local_68.m_size == 8) &&
              (QVar9.m_data = local_68.m_data, QVar9.m_size = 8, QVar22.m_data = L"centralx",
              QVar22.m_size = 8, cVar2 = QtPrivate::equalStrings(QVar9,QVar22), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_centralX = dVar1;
        this->m_has_attr_centralX = true;
      }
      else if ((local_68.m_size == 8) &&
              (QVar10.m_data = local_68.m_data, QVar10.m_size = 8, QVar23.m_data = L"centraly",
              QVar23.m_size = 8, cVar2 = QtPrivate::equalStrings(QVar10,QVar23), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_centralY = dVar1;
        this->m_has_attr_centralY = true;
      }
      else if ((local_68.m_size == 6) &&
              (QVar11.m_data = local_68.m_data, QVar11.m_size = 6, QVar24.m_data = L"focalx",
              QVar24.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar11,QVar24), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_focalX = dVar1;
        this->m_has_attr_focalX = true;
      }
      else if ((local_68.m_size == 6) &&
              (QVar12.m_data = local_68.m_data, QVar12.m_size = 6, QVar25.m_data = L"focaly",
              QVar25.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar12,QVar25), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_focalY = dVar1;
        this->m_has_attr_focalY = true;
      }
      else if ((local_68.m_size == 6) &&
              (QVar13.m_data = local_68.m_data, QVar13.m_size = 6, QVar26.m_data = L"radius",
              QVar26.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar13,QVar26), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_radius = dVar1;
        this->m_has_attr_radius = true;
      }
      else if ((local_68.m_size == 5) &&
              (QVar14.m_data = local_68.m_data, QVar14.m_size = 5, QVar27.m_data = L"angle",
              QVar27.m_size = 5, cVar2 = QtPrivate::equalStrings(QVar14,QVar27), cVar2 != '\0')) {
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        dVar1 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_angle = dVar1;
        this->m_has_attr_angle = true;
      }
      else {
        if ((local_68.m_size == 4) &&
           (QVar15.m_data = local_68.m_data, QVar15.m_size = 4, QVar28.m_data = L"type",
           QVar28.m_size = 4, cVar2 = QtPrivate::equalStrings(QVar15,QVar28), cVar2 != '\0')) {
          QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar4 + 0x50),
                           *(longlong *)(local_50.ptr + lVar4 + 0x58));
          QString::operator=(&this->m_attr_type,&local_80);
          this->m_has_attr_type = true;
        }
        else if ((local_68.m_size == 6) &&
                (QVar16.m_data = local_68.m_data, QVar16.m_size = 6, QVar29.m_data = L"spread",
                QVar29.m_size = 6, cVar2 = QtPrivate::equalStrings(QVar16,QVar29), cVar2 != '\0')) {
          QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar4 + 0x50),
                           *(longlong *)(local_50.ptr + lVar4 + 0x58));
          QString::operator=(&this->m_attr_spread,&local_80);
          this->m_has_attr_spread = true;
        }
        else if ((local_68.m_size == 0xe) &&
                (QVar17.m_data = local_68.m_data, QVar17.m_size = 0xe,
                QVar30.m_data = L"coordinatemode", QVar30.m_size = 0xe,
                cVar2 = QtPrivate::equalStrings(QVar17,QVar30), cVar2 != '\0')) {
          QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar4 + 0x50),
                           *(longlong *)(local_50.ptr + lVar4 + 0x58));
          QString::operator=(&this->m_attr_coordinateMode,&local_80);
          this->m_has_attr_coordinateMode = true;
        }
        else {
          local_98.a.m_size = 0x15;
          local_98.a.m_data = "Unexpected attribute ";
          local_98.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_80,&local_98);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        }
        if ((DomGradientStop *)local_80.d.d != (DomGradientStop *)0x0) {
          LOCK();
          *(int *)&(local_80.d.d)->super_QArrayData = *(int *)&(local_80.d.d)->super_QArrayData + -1
          ;
          UNLOCK();
          if (*(int *)&(local_80.d.d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar4 = lVar4 + 0x68;
    } while (local_50.size * 0x68 - lVar4 != 0);
  }
  iVar3 = QXmlStreamReader::error();
  if (iVar3 == 0) {
    do {
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar31.m_data = L"gradientstop";
        QVar31.m_size = 0xc;
        __nbytes_00 = L"gradientstop";
        iVar3 = QtPrivate::compareStrings(local_68,QVar31,CaseInsensitive);
        if (iVar3 == 0) {
          this_00 = (DomGradientStop *)operator_new(0x18);
          this_00->m_attr_position = 0.0;
          this_00->m_has_attr_position = false;
          *(undefined3 *)&this_00->field_0x9 = 0;
          this_00->m_children = 0;
          this_00->m_color = (DomColor *)0x0;
          DomGradientStop::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
          local_80.d.d = (Data *)this_00;
          QtPrivate::QPodArrayOps<DomGradientStop*>::emplace<DomGradientStop*&>
                    ((QPodArrayOps<DomGradientStop*> *)&this->m_gradientStop,
                     (this->m_gradientStop).d.size,(DomGradientStop **)&local_80);
          QList<DomGradientStop_*>::end(&this->m_gradientStop);
        }
        else {
          local_98.a.m_size = 0x13;
          local_98.a.m_data = "Unexpected element ";
          local_98.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_80,&local_98);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          if ((DomGradientStop *)local_80.d.d != (DomGradientStop *)0x0) {
            LOCK();
            *(int *)&(local_80.d.d)->super_QArrayData =
                 *(int *)&(local_80.d.d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&(local_80.d.d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (iVar3 == 5) break;
      iVar3 = QXmlStreamReader::error();
    } while (iVar3 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomGradient::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"startx"_s) {
            setAttributeStartX(attribute.value().toDouble());
            continue;
        }
        if (name == u"starty"_s) {
            setAttributeStartY(attribute.value().toDouble());
            continue;
        }
        if (name == u"endx"_s) {
            setAttributeEndX(attribute.value().toDouble());
            continue;
        }
        if (name == u"endy"_s) {
            setAttributeEndY(attribute.value().toDouble());
            continue;
        }
        if (name == u"centralx"_s) {
            setAttributeCentralX(attribute.value().toDouble());
            continue;
        }
        if (name == u"centraly"_s) {
            setAttributeCentralY(attribute.value().toDouble());
            continue;
        }
        if (name == u"focalx"_s) {
            setAttributeFocalX(attribute.value().toDouble());
            continue;
        }
        if (name == u"focaly"_s) {
            setAttributeFocalY(attribute.value().toDouble());
            continue;
        }
        if (name == u"radius"_s) {
            setAttributeRadius(attribute.value().toDouble());
            continue;
        }
        if (name == u"angle"_s) {
            setAttributeAngle(attribute.value().toDouble());
            continue;
        }
        if (name == u"type"_s) {
            setAttributeType(attribute.value().toString());
            continue;
        }
        if (name == u"spread"_s) {
            setAttributeSpread(attribute.value().toString());
            continue;
        }
        if (name == u"coordinatemode"_s) {
            setAttributeCoordinateMode(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"gradientstop"_s, Qt::CaseInsensitive)) {
                auto *v = new DomGradientStop();
                v->read(reader);
                m_gradientStop.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}